

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qassociativeiterable.cpp
# Opt level: O0

bool __thiscall QAssociativeIterable::containsKey(QAssociativeIterable *this,QVariant *key)

{
  long lVar1;
  void *pvVar2;
  QVariantTypeCoercer *in_RSI;
  long in_FS_OFFSET;
  void *keyData;
  QMetaAssociation meta;
  QVariantTypeCoercer keyCoercer;
  void *in_stack_ffffffffffffff48;
  QIterable<QMetaAssociation> *in_stack_ffffffffffffff50;
  undefined6 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5e;
  undefined1 in_stack_ffffffffffffff5f;
  QMetaType *in_stack_ffffffffffffff60;
  QVariant *in_stack_ffffffffffffff68;
  undefined1 local_39;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QtPrivate::QVariantTypeCoercer::QVariantTypeCoercer((QVariantTypeCoercer *)0x3339ab);
  QIterable<QMetaAssociation>::metaContainer(in_stack_ffffffffffffff50);
  QMetaAssociation::keyMetaType((QMetaAssociation *)in_stack_ffffffffffffff50);
  pvVar2 = QtPrivate::QVariantTypeCoercer::convert
                     (in_RSI,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  if (pvVar2 == (void *)0x0) {
    local_39 = false;
  }
  else {
    QIterable<QMetaAssociation>::constIterable((QIterable<QMetaAssociation> *)0x333a43);
    local_39 = QMetaAssociation::containsKey
                         ((QMetaAssociation *)
                          CONCAT17(in_stack_ffffffffffffff5f,
                                   CONCAT16(in_stack_ffffffffffffff5e,in_stack_ffffffffffffff58)),
                          in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  }
  QtPrivate::QVariantTypeCoercer::~QVariantTypeCoercer((QVariantTypeCoercer *)0x333ab6);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_39;
  }
  __stack_chk_fail();
}

Assistant:

bool QAssociativeIterable::containsKey(const QVariant &key)
{
    QtPrivate::QVariantTypeCoercer keyCoercer;
    QMetaAssociation meta = metaContainer();
    if (const void *keyData = keyCoercer.convert(key, meta.keyMetaType()))
        return meta.containsKey(constIterable(), keyData);
    return false;
}